

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O0

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftLeftOperator,bool,true,false>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  bool bVar1;
  char cVar2;
  unsigned_long in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined1 *in_RDI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  byte in_R9B;
  char rentry_2;
  char lentry_2;
  idx_t i;
  char rentry_1;
  char lentry_1;
  idx_t start;
  char rentry;
  char lentry;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t base_idx;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  idx_t in_stack_ffffffffffffff80;
  ulong uVar3;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  idx_t local_70;
  unsigned_long local_68;
  undefined1 local_5a;
  undefined1 local_59;
  unsigned_long local_58;
  unsigned_long local_50;
  ulong local_48;
  ulong local_40;
  unsigned_long local_38;
  byte local_29;
  TemplatedValidityMask<unsigned_long> *local_28;
  unsigned_long local_20;
  void *local_18;
  void *local_10;
  undefined1 *local_8;
  
  local_29 = in_R9B & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  AssertRestrictFunction
            (in_RSI,(void *)((long)in_RSI + in_RCX),in_RDX,(void *)((long)in_RDX + in_RCX),
             "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/include/duckdb/common/vector_operations/binary_executor.hpp"
             ,0x50);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_28);
  if (bVar1) {
    for (uVar3 = 0; uVar3 < local_20; uVar3 = uVar3 + 1) {
      cVar2 = BinaryStandardOperatorWrapper::
              Operation<bool,duckdb::BitwiseShiftLeftOperator,signed_char,signed_char,signed_char>
                        (SUB81(uVar3 >> 0x38,0),(char)(uVar3 >> 0x30),(char)(uVar3 >> 0x28),
                         (ValidityMask *)
                         CONCAT17(*local_8,CONCAT16(*(undefined1 *)((long)local_10 + uVar3),
                                                    in_stack_ffffffffffffff78)),0xe6d4e9);
      *(char *)((long)local_18 + uVar3) = cVar2;
    }
  }
  else {
    local_38 = 0;
    local_40 = TemplatedValidityMask<unsigned_long>::EntryCount(0xe6d2d1);
    for (local_48 = 0; local_48 < local_40; local_48 = local_48 + 1) {
      local_50 = TemplatedValidityMask<unsigned_long>::GetValidityEntry
                           ((TemplatedValidityMask<unsigned_long> *)
                            CONCAT17(in_stack_ffffffffffffff8f,
                                     CONCAT16(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88)),
                            in_stack_ffffffffffffff80);
      local_58 = MinValue<unsigned_long>(local_38 + 0x40,local_20);
      bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(local_50);
      if (bVar1) {
        for (; local_38 < local_58; local_38 = local_38 + 1) {
          local_59 = *local_8;
          local_5a = *(undefined1 *)((long)local_10 + local_38);
          cVar2 = BinaryStandardOperatorWrapper::
                  Operation<bool,duckdb::BitwiseShiftLeftOperator,signed_char,signed_char,signed_char>
                            (SUB81(in_stack_ffffffffffffff80 >> 0x38,0),
                             (char)(in_stack_ffffffffffffff80 >> 0x30),
                             (char)(in_stack_ffffffffffffff80 >> 0x28),
                             (ValidityMask *)
                             CONCAT17(in_stack_ffffffffffffff7f,
                                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78))
                             ,0xe6d382);
          *(char *)((long)local_18 + local_38) = cVar2;
        }
      }
      else {
        bVar1 = TemplatedValidityMask<unsigned_long>::NoneValid(local_50);
        if (bVar1) {
          local_38 = local_58;
        }
        else {
          local_68 = local_38;
          for (; local_38 < local_58; local_38 = local_38 + 1) {
            local_70 = local_38 - local_68;
            bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(&local_50,&local_70);
            if (bVar1) {
              in_stack_ffffffffffffff8f = *local_8;
              in_stack_ffffffffffffff8e = *(undefined1 *)((long)local_10 + local_38);
              cVar2 = BinaryStandardOperatorWrapper::
                      Operation<bool,duckdb::BitwiseShiftLeftOperator,signed_char,signed_char,signed_char>
                                (SUB81(in_stack_ffffffffffffff80 >> 0x38,0),
                                 (char)(in_stack_ffffffffffffff80 >> 0x30),
                                 (char)(in_stack_ffffffffffffff80 >> 0x28),
                                 (ValidityMask *)
                                 CONCAT17(in_stack_ffffffffffffff7f,
                                          CONCAT16(in_stack_ffffffffffffff7e,
                                                   in_stack_ffffffffffffff78)),0xe6d44c);
              *(char *)((long)local_18 + local_38) = cVar2;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}